

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_extension.cc
# Opt level: O0

char * google::protobuf::compiler::javanano::anon_unknown_6::GetTypeConstantName(Type type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Type local_14;
  char *pcStack_10;
  Type type_local;
  
  switch(type) {
  case TYPE_DOUBLE:
    pcStack_10 = "TYPE_DOUBLE";
    break;
  case TYPE_FLOAT:
    pcStack_10 = "TYPE_FLOAT";
    break;
  case TYPE_INT64:
    pcStack_10 = "TYPE_INT64";
    break;
  case TYPE_UINT64:
    pcStack_10 = "TYPE_UINT64";
    break;
  case TYPE_INT32:
    pcStack_10 = "TYPE_INT32";
    break;
  case TYPE_FIXED64:
    pcStack_10 = "TYPE_FIXED64";
    break;
  case TYPE_FIXED32:
    pcStack_10 = "TYPE_FIXED32";
    break;
  case TYPE_BOOL:
    pcStack_10 = "TYPE_BOOL";
    break;
  case TYPE_STRING:
    pcStack_10 = "TYPE_STRING";
    break;
  case TYPE_GROUP:
    pcStack_10 = "TYPE_GROUP";
    break;
  case TYPE_MESSAGE:
    pcStack_10 = "TYPE_MESSAGE";
    break;
  case TYPE_BYTES:
    pcStack_10 = "TYPE_BYTES";
    break;
  case TYPE_UINT32:
    pcStack_10 = "TYPE_UINT32";
    break;
  case TYPE_ENUM:
    pcStack_10 = "TYPE_ENUM";
    break;
  case TYPE_SFIXED32:
    pcStack_10 = "TYPE_SFIXED32";
    break;
  case TYPE_SFIXED64:
    pcStack_10 = "TYPE_SFIXED64";
    break;
  case TYPE_SINT32:
    pcStack_10 = "TYPE_SINT32";
    break;
  case MAX_TYPE:
    pcStack_10 = "TYPE_SINT64";
    break;
  default:
    local_14 = type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_extension.cc"
               ,0x4a);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* GetTypeConstantName(const FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32   : return "TYPE_INT32"   ;
    case FieldDescriptor::TYPE_UINT32  : return "TYPE_UINT32"  ;
    case FieldDescriptor::TYPE_SINT32  : return "TYPE_SINT32"  ;
    case FieldDescriptor::TYPE_FIXED32 : return "TYPE_FIXED32" ;
    case FieldDescriptor::TYPE_SFIXED32: return "TYPE_SFIXED32";
    case FieldDescriptor::TYPE_INT64   : return "TYPE_INT64"   ;
    case FieldDescriptor::TYPE_UINT64  : return "TYPE_UINT64"  ;
    case FieldDescriptor::TYPE_SINT64  : return "TYPE_SINT64"  ;
    case FieldDescriptor::TYPE_FIXED64 : return "TYPE_FIXED64" ;
    case FieldDescriptor::TYPE_SFIXED64: return "TYPE_SFIXED64";
    case FieldDescriptor::TYPE_FLOAT   : return "TYPE_FLOAT"   ;
    case FieldDescriptor::TYPE_DOUBLE  : return "TYPE_DOUBLE"  ;
    case FieldDescriptor::TYPE_BOOL    : return "TYPE_BOOL"    ;
    case FieldDescriptor::TYPE_STRING  : return "TYPE_STRING"  ;
    case FieldDescriptor::TYPE_BYTES   : return "TYPE_BYTES"   ;
    case FieldDescriptor::TYPE_ENUM    : return "TYPE_ENUM"    ;
    case FieldDescriptor::TYPE_GROUP   : return "TYPE_GROUP"   ;
    case FieldDescriptor::TYPE_MESSAGE : return "TYPE_MESSAGE" ;

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}